

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  GetterXsYs<double> *pGVar13;
  TransformerLogLog *pTVar14;
  ImPlotPlot *pIVar15;
  ImDrawVert *pIVar16;
  uint *puVar17;
  ImVec2 IVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  ImPlotContext *pIVar26;
  ImPlotContext *pIVar27;
  long lVar28;
  double dVar29;
  ImVec2 IVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar34;
  undefined1 auVar33 [16];
  double dVar35;
  ImVec2 IVar36;
  double dVar37;
  
  pIVar26 = GImPlot;
  pGVar13 = this->Getter;
  pTVar14 = this->Transformer;
  iVar10 = pGVar13->Count;
  lVar28 = (long)(((prim * 2 + pGVar13->Offset) % iVar10 + iVar10) % iVar10) * (long)pGVar13->Stride
  ;
  dVar37 = *(double *)((long)pGVar13->Ys + lVar28);
  dVar19 = log10(*(double *)((long)pGVar13->Xs + lVar28) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = pIVar26->CurrentPlot;
  dVar34 = pIVar26->LogDenX;
  dVar29 = (pIVar15->XAxis).Range.Min;
  dVar35 = (pIVar15->XAxis).Range.Max;
  dVar20 = log10(dVar37 / pIVar15->YAxis[pTVar14->YAxis].Range.Min);
  pIVar27 = GImPlot;
  iVar10 = pTVar14->YAxis;
  pIVar15 = pIVar26->CurrentPlot;
  pGVar13 = this->Getter;
  pTVar14 = this->Transformer;
  iVar11 = pGVar13->Count;
  dVar37 = pIVar26->My[iVar10];
  dVar3 = pIVar26->LogDenY[iVar10];
  lVar28 = (long)(((pGVar13->Offset + prim * 2 + 1) % iVar11 + iVar11) % iVar11) *
           (long)pGVar13->Stride;
  dVar4 = *(double *)((long)pGVar13->Ys + lVar28);
  dVar5 = (pIVar15->XAxis).Range.Min;
  dVar6 = pIVar26->Mx;
  dVar7 = pIVar15->YAxis[iVar10].Range.Min;
  dVar8 = pIVar15->YAxis[iVar10].Range.Max;
  fVar1 = pIVar26->PixelRange[iVar10].Min.x;
  fVar2 = pIVar26->PixelRange[iVar10].Min.y;
  dVar21 = log10(*(double *)((long)pGVar13->Xs + lVar28) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = pIVar27->CurrentPlot;
  dVar25 = pIVar27->LogDenX;
  dVar9 = (pIVar15->XAxis).Range.Min;
  dVar24 = (pIVar15->XAxis).Range.Max;
  dVar4 = log10(dVar4 / pIVar15->YAxis[pTVar14->YAxis].Range.Min);
  iVar10 = pTVar14->YAxis;
  pIVar15 = pIVar27->CurrentPlot;
  auVar31._8_8_ = dVar4;
  auVar31._0_8_ = dVar19;
  auVar32._8_4_ = SUB84(pIVar27->LogDenY[iVar10],0);
  auVar32._0_8_ = dVar34;
  auVar32._12_4_ = (int)((ulong)pIVar27->LogDenY[iVar10] >> 0x20);
  auVar32 = divpd(auVar31,auVar32);
  dVar34 = pIVar15->YAxis[iVar10].Range.Min;
  dVar29 = dVar6 * (((double)(float)auVar32._0_8_ * (dVar35 - dVar29) + dVar29) - dVar5) +
           (double)fVar1;
  dVar34 = pIVar27->My[iVar10] *
           (((double)(float)auVar32._8_8_ * (pIVar15->YAxis[iVar10].Range.Max - dVar34) + dVar34) -
           dVar34) + (double)pIVar27->PixelRange[iVar10].Min.y;
  auVar33._8_8_ = dVar20;
  auVar33._0_8_ = dVar21;
  auVar23._8_4_ = SUB84(dVar3,0);
  auVar23._0_8_ = dVar25;
  auVar23._12_4_ = (int)((ulong)dVar3 >> 0x20);
  auVar32 = divpd(auVar33,auVar23);
  dVar35 = pIVar27->Mx *
           (((double)(float)auVar32._0_8_ * (dVar24 - dVar9) + dVar9) - (pIVar15->XAxis).Range.Min)
           + (double)pIVar27->PixelRange[iVar10].Min.x;
  dVar37 = dVar37 * (((double)(float)auVar32._8_8_ * (dVar8 - dVar7) + dVar7) - dVar7) +
           (double)fVar2;
  IVar30.x = (float)dVar35;
  IVar30.y = (float)dVar37;
  IVar36.x = (float)dVar35;
  IVar36.y = (float)dVar34;
  IVar22.y = (float)dVar37;
  IVar22.x = (float)dVar29;
  DrawList->_VtxWritePtr->pos = IVar22;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar16 = DrawList->_VtxWritePtr;
  pIVar16->col = this->Col;
  IVar18.y = (float)dVar34;
  IVar18.x = (float)dVar29;
  pIVar16[1].pos = IVar18;
  pIVar16[1].uv = *uv;
  pIVar16 = DrawList->_VtxWritePtr;
  pIVar16[1].col = this->Col;
  pIVar16[2].pos = IVar36;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar16 = DrawList->_VtxWritePtr;
  pIVar16[2].col = this->Col;
  pIVar16[3].pos = IVar30;
  pIVar16[3].uv = *uv;
  pIVar16 = DrawList->_VtxWritePtr;
  pIVar16[3].col = this->Col;
  DrawList->_VtxWritePtr = pIVar16 + 4;
  uVar12 = DrawList->_VtxCurrentIdx;
  puVar17 = DrawList->_IdxWritePtr;
  *puVar17 = uVar12;
  puVar17[1] = uVar12 + 1;
  puVar17[2] = DrawList->_VtxCurrentIdx + 3;
  puVar17[3] = DrawList->_VtxCurrentIdx + 1;
  puVar17[4] = DrawList->_VtxCurrentIdx + 2;
  puVar17[5] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr = puVar17 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P1 = Transformer(Getter(2*prim));
        ImVec2 P2 = Transformer(Getter(2*prim+1));
        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = Col;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = Col;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = Col;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = Col;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }